

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

iobject * __thiscall network::get_object(network *this,int netid)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  int local_c;
  
  local_c = netid;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_iobject_*>,_std::_Select1st<std::pair<const_int,_iobject_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>
          ::find(&(this->objects_)._M_t,&local_c);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->objects_)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = iVar1._M_node[1]._M_parent;
  }
  return (iobject *)p_Var2;
}

Assistant:

iobject* network::get_object(int netid)
{
    object_map::iterator it = objects_.find(netid);
    if (it == objects_.end())
    {
        return NULL;
    }
    return it->second;
}